

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl_tree.c
# Opt level: O0

NodeAVL * avlRotateRight(NodeAVL *p)

{
  NodeAVL *pNVar1;
  NodeAVL *in_RDI;
  NodeAVL *pp;
  NodeAVL *q;
  NodeAVL *nd;
  
  nd = in_RDI->left;
  in_RDI->left = nd->right;
  if (nd->right != (NodeAVL *)0x0) {
    nd->right->parent = in_RDI;
  }
  nd->right = in_RDI;
  pNVar1 = in_RDI->parent;
  in_RDI->parent = nd;
  nd->parent = pNVar1;
  avlFixHeight(nd);
  avlFixHeight(nd);
  return nd;
}

Assistant:

static
NodeAVL* avlRotateRight( NodeAVL* p ){
    #ifdef DEBUG_AVL
      printf( "avlRotateRight id=%d\n", p->id );
    #endif
    NodeAVL* q = p->left;
    p->left = q->right;
    if( q->right ) q->right->parent = p;
    q->right = p;
    NodeAVL* pp = p->parent;
    p->parent = q;
    q->parent = pp;
    avlFixHeight(p);
    avlFixHeight(q);
    return q;
}